

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_cache.c
# Opt level: O0

int cache_put(uint64_t a,uint64_t b,uint64_t c,uint64_t res)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint64_t uVar5;
  cache_entry_t pcVar6;
  uint32_t new_s;
  uint32_t hash_mask;
  uint32_t s;
  cache_entry_t bucket;
  uint32_t *s_bucket;
  uint64_t hash;
  uint64_t res_local;
  uint64_t c_local;
  uint64_t b_local;
  uint64_t a_local;
  
  uVar5 = cache_hash(a,b,c);
  puVar1 = cache_status + (uVar5 & cache_mask);
  pcVar6 = cache_table + (uVar5 & cache_mask);
  uVar3 = *puVar1;
  if ((uVar3 & 0x80000000) == 0) {
    s_bucket._4_4_ = (uint)(uVar5 >> 0x20);
    uVar4 = uVar3 + 1 & 0xffff | s_bucket._4_4_ & 0x3fff0000;
    LOCK();
    uVar2 = *puVar1;
    if (uVar3 == uVar2) {
      *puVar1 = uVar4 | 0x80000000;
    }
    UNLOCK();
    if (uVar3 == uVar2) {
      pcVar6->a = a;
      pcVar6->b = b;
      pcVar6->c = c;
      pcVar6->res = res;
      *puVar1 = uVar4;
      a_local._4_4_ = 1;
    }
    else {
      a_local._4_4_ = 0;
    }
  }
  else {
    a_local._4_4_ = 0;
  }
  return a_local._4_4_;
}

Assistant:

int
cache_put(uint64_t a, uint64_t b, uint64_t c, uint64_t res)
{
    const uint64_t hash = cache_hash(a, b, c);
#if CACHE_MASK
    _Atomic(uint32_t) *s_bucket = (_Atomic(uint32_t)*)cache_status + (hash & cache_mask);
    cache_entry_t bucket = cache_table + (hash & cache_mask);
#else
    _Atomic(uint32_t) *s_bucket = (_Atomic(uint32_t)*)cache_status + (hash % cache_size);
    cache_entry_t bucket = cache_table + (hash % cache_size);
#endif
    uint32_t s = atomic_load_explicit(s_bucket, memory_order_relaxed);
    // abort if locked
    if (s & 0x80000000) return 0;
    // abort if hash identical -> no: in iscasmc this occasionally causes timeouts?!
    const uint32_t hash_mask = (hash>>32) & 0x3fff0000;
    // if ((s & 0x7fff0000) == hash_mask) return 0;
    // use cas to claim bucket
    const uint32_t new_s = ((s+1) & 0x0000ffff) | hash_mask;
    if (!atomic_compare_exchange_weak(s_bucket, &s, new_s | 0x80000000)) return 0;
    // cas succesful: write data
    bucket->a = a;
    bucket->b = b;
    bucket->c = c;
    bucket->res = res;
    // after compiler_barrier(), unlock status field
    atomic_store_explicit(s_bucket, new_s, memory_order_release);
    return 1;
}